

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

strbuf * des3_decrypt_pubkey_ossh_wrapper(ptrlen key,ptrlen iv,ptrlen data)

{
  strbuf *psVar1;
  strbuf *sb;
  ptrlen data_local;
  ptrlen iv_local;
  ptrlen key_local;
  
  if (key.len != 0x18) {
    fatal_error("des3_decrypt_pubkey_ossh: key must be 24 bytes long");
  }
  if (iv.len != 8) {
    fatal_error("des3_encrypt_pubkey_ossh: iv must be 8 bytes long");
  }
  if (((undefined1  [16])data & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
    fatal_error("des3_decrypt_pubkey_ossh: data must be a multiple of 8 bytes");
  }
  psVar1 = strbuf_dup(data);
  des3_decrypt_pubkey_ossh(key.ptr,iv.ptr,psVar1->u,(int)psVar1->len);
  return psVar1;
}

Assistant:

strbuf *des3_decrypt_pubkey_ossh_wrapper(ptrlen key, ptrlen iv, ptrlen data)
{
    if (key.len != 24)
        fatal_error("des3_decrypt_pubkey_ossh: key must be 24 bytes long");
    if (iv.len != 8)
        fatal_error("des3_encrypt_pubkey_ossh: iv must be 8 bytes long");
    if (data.len % 8 != 0)
        fatal_error("des3_decrypt_pubkey_ossh: data must be a multiple of 8 bytes");
    strbuf *sb = strbuf_dup(data);
    des3_decrypt_pubkey_ossh(key.ptr, iv.ptr, sb->u, sb->len);
    return sb;
}